

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-world.c
# Opt level: O0

void run_game_loop(void)

{
  bool bVar1;
  wchar_t wVar2;
  int iVar3;
  _Bool arena;
  
  process_player_cleanup();
  if ((player->upkeep->playing & 1U) == 0) goto LAB_0015ace8;
  process_player();
  wVar2 = player->upkeep->energy_use;
  do {
    if (wVar2 == L'\0') {
      return;
    }
LAB_0015ace8:
    do {
      if ((int)player->energy < (int)(uint)z_info->move_energy) goto LAB_0015adb0;
      event_signal(EVENT_ANIMATE);
      process_monsters(player->energy + L'\x01');
      if ((((player->is_dead & 1U) != 0) || ((player->upkeep->playing & 1U) == 0)) ||
         ((player->upkeep->generate_level & 1U) != 0)) goto LAB_0015adb0;
    } while ((player->upkeep->playing & 1U) == 0);
    process_player();
    wVar2 = player->upkeep->energy_use;
  } while( true );
LAB_0015b02d:
  while ((int)player->energy < (int)(uint)z_info->move_energy) {
LAB_0015adb0:
    notice_stuff(player);
    handle_stuff(player);
    event_signal(EVENT_REFRESH);
    if ((player->is_dead & 1U) != 0) {
      return;
    }
    if ((player->upkeep->playing & 1U) == 0) {
      return;
    }
    if ((player->upkeep->generate_level & 1U) == 0) {
      process_monsters(L'\0');
      reset_monsters();
      notice_stuff(player);
      handle_stuff(player);
      event_signal(EVENT_REFRESH);
      if ((player->is_dead & 1U) != 0) {
        return;
      }
      if ((player->upkeep->playing & 1U) == 0) {
        return;
      }
      if ((turn % 10 == 0) && ((player->upkeep->generate_level & 1U) == 0)) {
        process_world(cave);
        notice_stuff(player);
        handle_stuff(player);
        event_signal(EVENT_REFRESH);
        if ((player->is_dead & 1U) != 0) {
          return;
        }
        if ((player->upkeep->playing & 1U) == 0) {
          return;
        }
      }
      wVar2 = turn_energy((player->state).speed);
      player->energy = player->energy + (short)wVar2;
      turn = turn + 1;
    }
    if ((player->upkeep->generate_level & 1U) != 0) {
      bVar1 = false;
      if ((((character_dungeon & 1U) != 0) && (on_leave_level(), cave->name != (char *)0x0)) &&
         (iVar3 = strcmp(cave->name,"arena"), iVar3 == 0)) {
        bVar1 = true;
      }
      prepare_next_level(player);
      on_new_level();
      player->upkeep->generate_level = false;
      if ((bVar1) &&
         (player->upkeep->arena_level = false, player->upkeep->health_who != (monster *)0x0)) {
        kill_arena_monster(player->upkeep->health_who);
      }
    }
  }
  event_signal(EVENT_ANIMATE);
  process_monsters(player->energy + L'\x01');
  if ((((player->is_dead & 1U) != 0) || ((player->upkeep->playing & 1U) == 0)) ||
     ((player->upkeep->generate_level & 1U) != 0)) goto LAB_0015adb0;
  if (((player->upkeep->playing & 1U) != 0) &&
     (process_player(), player->upkeep->energy_use == L'\0')) {
    return;
  }
  goto LAB_0015b02d;
}

Assistant:

void run_game_loop(void)
{
	/* Tidy up after the player's command */
	process_player_cleanup();

	/* Keep processing the player until they use some energy or
	 * another command is needed */
	while (player->upkeep->playing) {
		process_player();
		if (player->upkeep->energy_use)
			break;
		else
			return;
	}

	/* The player may still have enough energy to move, so we run another
	 * player turn before processing the rest of the world */
	while (player->energy >= z_info->move_energy) {
		/* Do any necessary animations */
		event_signal(EVENT_ANIMATE);
		
		/* Process monster with even more energy first */
		process_monsters(player->energy + 1);
		if (player->is_dead || !player->upkeep->playing ||
			player->upkeep->generate_level)
			break;

		/* Process the player until they use some energy */
		while (player->upkeep->playing) {
			process_player();
			if (player->upkeep->energy_use)
				break;
			else
				return;
		}
	}

	/* Now that the player's turn is fully complete, we run the main loop 
	 * until player input is needed again */
	while (true) {
		notice_stuff(player);
		handle_stuff(player);
		event_signal(EVENT_REFRESH);

		/* Process the rest of the world, give the player energy and 
		 * increment the turn counter unless we need to stop playing or
		 * generate a new level */
		if (player->is_dead || !player->upkeep->playing)
			return;
		else if (!player->upkeep->generate_level) {
			/* Process the rest of the monsters */
			process_monsters(0);

			/* Mark all monsters as ready to act when they have the energy */
			reset_monsters();

			/* Refresh */
			notice_stuff(player);
			handle_stuff(player);
			event_signal(EVENT_REFRESH);
			if (player->is_dead || !player->upkeep->playing)
				return;

			/* Process the world every ten turns */
			if (!(turn % 10) && !player->upkeep->generate_level) {
				process_world(cave);

				/* Refresh */
				notice_stuff(player);
				handle_stuff(player);
				event_signal(EVENT_REFRESH);
				if (player->is_dead || !player->upkeep->playing)
					return;
			}

			/* Give the player some energy */
			player->energy += turn_energy(player->state.speed);

			/* Count game turns */
			turn++;
		}

		/* Make a new level if requested */
		if (player->upkeep->generate_level) {
			bool arena = false;
			if (character_dungeon) {
				on_leave_level();
				if (cave->name && streq(cave->name, "arena")) {
					arena = true;
				}
			}

			prepare_next_level(player);
			on_new_level();

			player->upkeep->generate_level = false;

			/* Kill arena monster */
			if (arena) {
				player->upkeep->arena_level = false;
				if (player->upkeep->health_who) {
					kill_arena_monster(player->upkeep->health_who);
				}
			}
		}

		/* If the player has enough energy to move they now do so, after
		 * any monsters with more energy take their turns */
		while (player->energy >= z_info->move_energy) {
			/* Do any necessary animations */
			event_signal(EVENT_ANIMATE);

			/* Process monster with even more energy first */
			process_monsters(player->energy + 1);
			if (player->is_dead || !player->upkeep->playing ||
				player->upkeep->generate_level)
				break;

			/* Process the player until they use some energy */
			while (player->upkeep->playing) {
				process_player();
				if (player->upkeep->energy_use)
					break;
				else
					return;
			}
		}
	}
}